

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O1

bool __thiscall Quest_Context::DoAction(Quest_Context *this,Action *action)

{
  deque<util::variant,_std::allocator<util::variant>_> *this_00;
  int *piVar1;
  uchar *puVar2;
  byte bVar3;
  undefined2 uVar4;
  pointer pcVar5;
  pointer ppMVar6;
  World *pWVar7;
  Map *pMVar8;
  Quest_Context *this_01;
  uchar uVar9;
  uchar y;
  bool bVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  _Elt_pointer pvVar15;
  mapped_type *pmVar16;
  time_t tVar17;
  ushort *puVar18;
  iterator iVar19;
  _Rb_tree_header *p_Var20;
  mapped_type *pmVar21;
  mapped_type *pmVar22;
  size_type sVar23;
  variant *pvVar24;
  runtime_error *prVar25;
  _Base_ptr p_Var26;
  Character **__args;
  Character *pCVar27;
  short sVar28;
  string *this_02;
  list<Character_*,_std::allocator<Character_*>_> *plVar29;
  _Base_ptr p_Var30;
  _List_node_base *p_Var31;
  pointer ppMVar32;
  string stat;
  string function_name;
  PacketBuilder builder_7;
  shared_ptr<Quest_Context> context_2;
  Quest *quest;
  undefined1 local_1a8 [48];
  long *local_178 [2];
  long local_168 [2];
  undefined1 local_158 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148 [2];
  Quest_Context *local_128;
  _Alloc_hider local_120;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  _Base_ptr local_38;
  
  if ((this->quest->quest->info).disabled != false) {
    return false;
  }
  local_178[0] = local_168;
  pcVar5 = (action->expr).function._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_178,pcVar5,pcVar5 + (action->expr).function._M_string_length);
  iVar11 = std::__cxx11::string::compare((char *)local_178);
  if (iVar11 == 0) {
    pvVar15 = (action->expr).args.super__Deque_base<util::variant,_std::allocator<util::variant>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    uVar14 = (long)pvVar15 -
             (long)(action->expr).args.
                   super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                   super__Deque_impl_data._M_start._M_first >> 6;
    if (7 < uVar14) {
      pvVar15 = (_Elt_pointer)
                ((ulong)(((uint)uVar14 & 7) << 6) +
                *(long *)((long)(action->expr).args.
                                super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_node +
                         (uVar14 & 0xfffffffffffffff8)));
    }
    util::variant::GetString_abi_cxx11_((string *)local_158,pvVar15);
    util::lowercase((string *)local_1a8,(string *)local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._0_8_ != local_148) {
      operator_delete((void *)local_158._0_8_,local_148[0]._M_allocated_capacity + 1);
    }
    EOPlus::Context::SetState(&this->super_Context,(string *)local_1a8,true);
LAB_00186a49:
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_00186a57;
  }
  else {
    iVar11 = std::__cxx11::string::compare((char *)local_178);
    if (iVar11 == 0) {
      pcVar5 = local_1a8 + 0x10;
      local_1a8._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"c","");
      iVar19 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::find(&(this->progress)._M_t,(key_type *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar5) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((_Rb_tree_header *)iVar19._M_node == &(this->progress)._M_t._M_impl.super__Rb_tree_header)
      {
        bVar10 = true;
        Character::ResetQuest(this->character,this->quest->id);
        goto LAB_00186a66;
      }
      local_1a8._0_8_ = pcVar5;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"done","");
      EOPlus::Context::SetState(&this->super_Context,(string *)local_1a8,true);
      if ((pointer)local_1a8._0_8_ != pcVar5) goto LAB_00186a57;
    }
    else {
      iVar11 = std::__cxx11::string::compare((char *)local_178);
      if (iVar11 == 0) {
        tVar17 = time((time_t *)0x0);
        pcVar5 = local_1a8 + 0x10;
        local_1a8._0_8_ = pcVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"d","");
        puVar18 = (ushort *)
                  std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                  ::operator[](&this->progress,(key_type *)local_1a8);
        *puVar18 = (short)(SUB168(SEXT816(tVar17) * SEXT816(0x1845c8a0ce512957),8) >> 0xd) -
                   (SUB162(SEXT816(tVar17) * SEXT816(0x1845c8a0ce512957),0xe) >> 0xf) & 0x7fff;
        if ((pointer)local_1a8._0_8_ != pcVar5) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        local_1a8._0_8_ = pcVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"c","");
        pmVar16 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                  ::operator[](&this->progress,(key_type *)local_1a8);
        *pmVar16 = *pmVar16 + 1;
        if ((pointer)local_1a8._0_8_ != pcVar5) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        local_1a8._0_8_ = pcVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"done","");
        EOPlus::Context::SetState(&this->super_Context,(string *)local_1a8,true);
        if ((pointer)local_1a8._0_8_ != pcVar5) {
LAB_00186a57:
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
      }
      else {
        iVar11 = std::__cxx11::string::compare((char *)local_178);
        if (iVar11 != 0) {
          iVar11 = std::__cxx11::string::compare((char *)local_178);
          if (iVar11 == 0) {
            pvVar15 = (action->expr).args.
                      super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                      super__Deque_impl_data._M_start._M_cur;
            uVar14 = (long)pvVar15 -
                     (long)(action->expr).args.
                           super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                           super__Deque_impl_data._M_start._M_first >> 6;
            if (7 < uVar14) {
              pvVar15 = (_Elt_pointer)
                        ((ulong)(((uint)uVar14 & 7) << 6) +
                        *(long *)((long)(action->expr).args.
                                        super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_node +
                                 (uVar14 & 0xfffffffffffffff8)));
            }
            iVar11 = util::variant::GetInt(pvVar15);
            Character::GetQuest((Character *)local_158,(short)this->character);
            this_00 = &(action->expr).args;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158._0_8_ ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              __args = &this->character;
              p_Var20 = &((*__args)->world->quests)._M_t._M_impl.super__Rb_tree_header;
              sVar28 = (short)iVar11;
              p_Var30 = ((*__args)->world->quests)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent;
              p_Var26 = &p_Var20->_M_header;
              for (; p_Var30 != (_Base_ptr)0x0; p_Var30 = (&p_Var30->_M_left)[(short)uVar4 < sVar28]
                  ) {
                uVar4 = (undefined2)p_Var30[1]._M_color;
                if (sVar28 <= (short)uVar4) {
                  p_Var26 = p_Var30;
                }
              }
              p_Var30 = &p_Var20->_M_header;
              if (((_Rb_tree_header *)p_Var26 != p_Var20) &&
                 (p_Var30 = p_Var26, sVar28 < (short)p_Var26[1]._M_color)) {
                p_Var30 = &p_Var20->_M_header;
              }
              if ((_Rb_tree_header *)p_Var30 != p_Var20) {
                local_38 = p_Var30[1]._M_parent;
                local_128 = (element_type *)0x0;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                __shared_count<Quest_Context,std::allocator<Quest_Context>,Character*&,Quest*&>
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_120,&local_128,
                           (allocator<Quest_Context> *)local_1a8,__args,(Quest **)&local_38);
                pmVar21 = std::
                          map<short,_std::shared_ptr<Quest_Context>,_std::less<short>,_std::allocator<std::pair<const_short,_std::shared_ptr<Quest_Context>_>_>_>
                          ::operator[](&(*__args)->quests,(key_type *)(p_Var30 + 1));
                (pmVar21->super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                     local_128;
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                          (&(pmVar21->super___shared_ptr<Quest_Context,_(__gnu_cxx::_Lock_policy)2>)
                            ._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_120);
                this_01 = local_128;
                sVar23 = std::deque<util::variant,_std::allocator<util::variant>_>::size(this_00);
                if (sVar23 < 2) {
                  local_1a8._0_8_ = local_1a8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"begin","");
                }
                else {
                  pvVar15 = (action->expr).args.
                            super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl
                            .super__Deque_impl_data._M_start._M_cur;
                  uVar14 = ((long)pvVar15 -
                            (long)(action->expr).args.
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_first >> 6) + 1;
                  if (uVar14 < 8) {
                    pvVar24 = pvVar15 + 1;
                  }
                  else {
                    pvVar24 = (variant *)
                              ((ulong)(((uint)uVar14 & 7) << 6) +
                              *(long *)((long)(action->expr).args.
                                              super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                              ._M_impl.super__Deque_impl_data._M_start._M_node +
                                       (uVar14 & 0xfffffffffffffff8)));
                  }
                  util::variant::GetString_abi_cxx11_((string *)local_1a8,pvVar24);
                }
                EOPlus::Context::SetState(&this_01->super_Context,(string *)local_1a8,true);
                if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_p !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._M_p);
                }
              }
            }
            else {
              EOPlus::Context::StateName_abi_cxx11_((string *)local_1a8,(Context *)local_158._0_8_);
              iVar11 = std::__cxx11::string::compare(local_1a8);
              pcVar5 = local_1a8 + 0x10;
              if ((pointer)local_1a8._0_8_ != pcVar5) {
                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
              }
              if (iVar11 == 0) {
                sVar23 = std::deque<util::variant,_std::allocator<util::variant>_>::size(this_00);
                if (sVar23 < 2) {
                  local_1a8._0_8_ = pcVar5;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"begin","");
                }
                else {
                  pvVar15 = (action->expr).args.
                            super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl
                            .super__Deque_impl_data._M_start._M_cur;
                  uVar14 = ((long)pvVar15 -
                            (long)(action->expr).args.
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_first >> 6) + 1;
                  if (uVar14 < 8) {
                    pvVar24 = pvVar15 + 1;
                  }
                  else {
                    pvVar24 = (variant *)
                              ((ulong)(((uint)uVar14 & 7) << 6) +
                              *(long *)((long)(action->expr).args.
                                              super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                              ._M_impl.super__Deque_impl_data._M_start._M_node +
                                       (uVar14 & 0xfffffffffffffff8)));
                  }
                  util::variant::GetString_abi_cxx11_((string *)local_1a8,pvVar24);
                }
                EOPlus::Context::SetState((Context *)local_158._0_8_,(string *)local_1a8,true);
                if ((pointer)local_1a8._0_8_ != pcVar5) {
                  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                }
              }
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
            }
          }
          else {
            iVar11 = std::__cxx11::string::compare((char *)local_178);
            if (iVar11 == 0) {
              pvVar15 = (action->expr).args.
                        super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur;
              uVar14 = (long)pvVar15 -
                       (long)(action->expr).args.
                             super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                             _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
              if (7 < uVar14) {
                pvVar15 = (_Elt_pointer)
                          ((ulong)(((uint)uVar14 & 7) << 6) +
                          *(long *)((long)(action->expr).args.
                                          super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_node +
                                   (uVar14 & 0xfffffffffffffff8)));
              }
              sVar28 = this->quest->id;
              iVar11 = util::variant::GetInt(pvVar15);
              Character::GetQuest((Character *)local_158,(short)this->character);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_158._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                local_1a8._0_8_ = local_1a8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"c","");
                iVar19 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                         ::find(&(this->progress)._M_t,(key_type *)local_1a8);
                if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                  operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                }
                if ((_Rb_tree_header *)iVar19._M_node ==
                    &(this->progress)._M_t._M_impl.super__Rb_tree_header) {
                  local_1a8._0_8_ = local_1a8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"done","");
                  EOPlus::Context::SetState((Context *)local_158._0_8_,(string *)local_1a8,true);
                  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
                    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                  }
                }
                else {
                  Character::ResetQuest(this->character,(short)iVar11);
                }
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
              }
              bVar10 = true;
              if ((short)iVar11 == sVar28) goto LAB_00186a66;
            }
            else {
              iVar11 = std::__cxx11::string::compare((char *)local_178);
              if (iVar11 == 0) {
                pvVar15 = (action->expr).args.
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                uVar14 = (long)pvVar15 -
                         (long)(action->expr).args.
                               super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
                if (7 < uVar14) {
                  pvVar15 = (_Elt_pointer)
                            ((ulong)(((uint)uVar14 & 7) << 6) +
                            *(long *)((long)(action->expr).args.
                                            super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                            ._M_impl.super__Deque_impl_data._M_start._M_node +
                                     (uVar14 & 0xfffffffffffffff8)));
                }
                sVar28 = this->quest->id;
                iVar11 = util::variant::GetInt(pvVar15);
                pvVar15 = (action->expr).args.
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start._M_cur;
                uVar14 = ((long)pvVar15 -
                          (long)(action->expr).args.
                                super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_first >> 6) + 1;
                if (uVar14 < 8) {
                  pvVar24 = pvVar15 + 1;
                }
                else {
                  pvVar24 = (variant *)
                            ((ulong)(((uint)uVar14 & 7) << 6) +
                            *(long *)((long)(action->expr).args.
                                            super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                            ._M_impl.super__Deque_impl_data._M_start._M_node +
                                     (uVar14 & 0xfffffffffffffff8)));
                }
                util::variant::GetString_abi_cxx11_((string *)local_1a8,pvVar24);
                Character::GetQuest((Character *)local_158,(short)this->character);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
                }
                if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)local_158._0_8_ !=
                     (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0) &&
                   (EOPlus::Context::SetState((Context *)local_158._0_8_,(string *)local_1a8,true),
                   (short)iVar11 == sVar28)) goto LAB_00186a49;
                local_b8._M_dataplus._M_p = (pointer)local_1a8._0_8_;
                if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_00187083;
              }
              else {
                iVar11 = std::__cxx11::string::compare((char *)local_178);
                if (iVar11 == 0) {
                  pvVar15 = (action->expr).args.
                            super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl
                            .super__Deque_impl_data._M_start._M_cur;
                  uVar14 = (long)pvVar15 -
                           (long)(action->expr).args.
                                 super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                 _M_impl.super__Deque_impl_data._M_start._M_first >> 6;
                  if (7 < uVar14) {
                    pvVar15 = (_Elt_pointer)
                              ((ulong)(((uint)uVar14 & 7) << 6) +
                              *(long *)((long)(action->expr).args.
                                              super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                              ._M_impl.super__Deque_impl_data._M_start._M_node +
                                       (uVar14 & 0xfffffffffffffff8)));
                  }
                  pCVar27 = this->character;
                  util::variant::GetString_abi_cxx11_(&local_b8,pvVar15);
                  (*(pCVar27->super_Command_Source)._vptr_Command_Source[6])(pCVar27,&local_b8);
                  local_1a8._16_8_ = local_b8.field_2._0_8_;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
LAB_00187083:
                    operator_delete(local_b8._M_dataplus._M_p,local_1a8._16_8_ + 1);
                  }
                }
                else {
                  iVar11 = std::__cxx11::string::compare((char *)local_178);
                  if (iVar11 == 0) {
                    sVar23 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                                       (&(action->expr).args);
                    if (sVar23 == 0) {
                      uVar9 = '\x05';
                    }
                    else {
                      pvVar15 = (action->expr).args.
                                super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                _M_impl.super__Deque_impl_data._M_start._M_cur;
                      uVar14 = (long)pvVar15 -
                               (long)(action->expr).args.
                                     super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                     ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
                      if (7 < uVar14) {
                        pvVar15 = (_Elt_pointer)
                                  ((ulong)(((uint)uVar14 & 7) << 6) +
                                  *(long *)((long)(action->expr).args.
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                           (uVar14 & 0xfffffffffffffff8)));
                      }
                      iVar12 = util::variant::GetInt(pvVar15);
                      iVar11 = 8;
                      if (iVar12 < 8) {
                        iVar11 = iVar12;
                      }
                      uVar9 = '\x01';
                      if (1 < iVar11) {
                        uVar9 = (uchar)iVar11;
                      }
                    }
                    Map::Effect(this->character->map,MAP_EFFECT_QUAKE,uVar9);
                  }
                  else {
                    iVar11 = std::__cxx11::string::compare((char *)local_178);
                    if (iVar11 == 0) {
                      sVar23 = std::deque<util::variant,_std::allocator<util::variant>_>::size
                                         (&(action->expr).args);
                      if (sVar23 == 0) {
                        uVar9 = '\x05';
                      }
                      else {
                        pvVar15 = (action->expr).args.
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_cur;
                        uVar14 = (long)pvVar15 -
                                 (long)(action->expr).args.
                                       super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
                        if (7 < uVar14) {
                          pvVar15 = (_Elt_pointer)
                                    ((ulong)(((uint)uVar14 & 7) << 6) +
                                    *(long *)((long)(action->expr).args.
                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                             (uVar14 & 0xfffffffffffffff8)));
                        }
                        iVar12 = util::variant::GetInt(pvVar15);
                        iVar11 = 8;
                        if (iVar12 < 8) {
                          iVar11 = iVar12;
                        }
                        uVar9 = '\x01';
                        if (1 < iVar11) {
                          uVar9 = (uchar)iVar11;
                        }
                      }
                      pWVar7 = this->character->world;
                      ppMVar6 = (pWVar7->maps).super__Vector_base<Map_*,_std::allocator<Map_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish;
                      for (ppMVar32 = (pWVar7->maps).
                                      super__Vector_base<Map_*,_std::allocator<Map_*>_>._M_impl.
                                      super__Vector_impl_data._M_start; ppMVar32 != ppMVar6;
                          ppMVar32 = ppMVar32 + 1) {
                        if ((*ppMVar32)->exists == true) {
                          Map::Effect(*ppMVar32,MAP_EFFECT_QUAKE,uVar9);
                        }
                      }
                    }
                    else {
                      iVar11 = std::__cxx11::string::compare((char *)local_178);
                      if ((iVar11 == 0) ||
                         (iVar11 = std::__cxx11::string::compare((char *)local_178), iVar11 == 0)) {
                        pvVar15 = (action->expr).args.
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_cur;
                        uVar14 = (long)pvVar15 -
                                 (long)(action->expr).args.
                                       super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                       ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
                        if (7 < uVar14) {
                          pvVar15 = (action->expr).args.
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node[uVar14 >> 3] +
                                    uVar14 + (uVar14 >> 3) * -8;
                        }
                        pCVar27 = this->character;
                        iVar11 = util::variant::GetInt(pvVar15);
                        sVar28 = (short)iVar11;
                        pvVar15 = (action->expr).args.
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_cur;
                        uVar14 = ((long)pvVar15 -
                                  (long)(action->expr).args.
                                        super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_first >> 6) + 1;
                        if (uVar14 < 8) {
                          pvVar24 = pvVar15 + 1;
                        }
                        else {
                          pvVar24 = (action->expr).args.
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node[uVar14 >> 3] +
                                    uVar14 + (uVar14 >> 3) * -8;
                        }
                        iVar11 = util::variant::GetInt(pvVar24);
                        uVar9 = (uchar)iVar11;
                        pvVar15 = (action->expr).args.
                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                  _M_impl.super__Deque_impl_data._M_start._M_cur;
                        uVar14 = ((long)pvVar15 -
                                  (long)(action->expr).args.
                                        super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_first >> 6) + 2;
                        if (uVar14 < 8) {
                          pvVar24 = pvVar15 + 2;
                        }
                        else {
                          pvVar24 = (action->expr).args.
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_node[uVar14 >> 3] +
                                    uVar14 + (uVar14 >> 3) * -8;
                        }
                        iVar11 = util::variant::GetInt(pvVar24);
                        y = (uchar)iVar11;
LAB_00187432:
                        Character::Warp(pCVar27,sVar28,uVar9,y,WARP_ANIMATION_NONE);
                      }
                      else {
                        iVar11 = std::__cxx11::string::compare((char *)local_178);
                        if (iVar11 == 0) {
                          pvVar15 = (action->expr).args.
                                    super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_cur;
                          uVar14 = (long)pvVar15 -
                                   (long)(action->expr).args.
                                         super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                         ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
                          if (7 < uVar14) {
                            pvVar15 = (_Elt_pointer)
                                      ((ulong)(((uint)uVar14 & 7) << 6) +
                                      *(long *)((long)(action->expr).args.
                                                                                                            
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                               (uVar14 & 0xfffffffffffffff8)));
                          }
                          pCVar27 = this->character;
                          iVar11 = util::variant::GetInt(pvVar15);
                          Character::PlaySound(pCVar27,(uchar)iVar11);
                        }
                        else {
                          iVar11 = std::__cxx11::string::compare((char *)local_178);
                          if (iVar11 == 0) {
                            pvVar15 = (action->expr).args.
                                      super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                      ._M_impl.super__Deque_impl_data._M_start._M_cur;
                            uVar14 = (long)pvVar15 -
                                     (long)(action->expr).args.
                                           super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                           ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
                            if (7 < uVar14) {
                              pvVar15 = (_Elt_pointer)
                                        ((ulong)(((uint)uVar14 & 7) << 6) +
                                        *(long *)((long)(action->expr).args.
                                                                                                                
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                 (uVar14 & 0xfffffffffffffff8)));
                            }
                            iVar11 = util::variant::GetInt(pvVar15);
                            piVar1 = &this->character->exp;
                            *piVar1 = *piVar1 + iVar11;
                            pCVar27 = this->character;
                            pWVar7 = pCVar27->map->world;
                            pcVar5 = local_1a8 + 0x10;
                            local_1a8._0_8_ = pcVar5;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)local_1a8,"MaxExp","");
                            pmVar22 = std::__detail::
                                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar7->config,(key_type *)local_1a8);
                            iVar12 = util::variant::GetInt(pmVar22);
                            iVar11 = pCVar27->exp;
                            if (iVar12 < iVar11) {
                              iVar11 = iVar12;
                            }
                            this->character->exp = iVar11;
                            if ((pointer)local_1a8._0_8_ != pcVar5) {
                              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                            }
                            bVar10 = false;
                            while( true ) {
                              bVar3 = this->character->level;
                              pWVar7 = this->character->map->world;
                              local_1a8._0_8_ = pcVar5;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_1a8,"MaxLevel","");
                              pmVar22 = std::__detail::
                                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar7->config,(key_type *)local_1a8);
                              iVar11 = util::variant::GetInt(pmVar22);
                              if (iVar11 <= (int)(uint)bVar3) break;
                              pCVar27 = this->character;
                              iVar11 = pCVar27->exp;
                              iVar12 = (pCVar27->map->world->exp_table)._M_elems
                                       [(ulong)pCVar27->level + 1];
                              if ((pointer)local_1a8._0_8_ != pcVar5) {
                                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                              }
                              if (iVar11 < iVar12) goto LAB_001877ba;
                              puVar2 = &this->character->level;
                              *puVar2 = *puVar2 + '\x01';
                              pWVar7 = this->character->map->world;
                              local_1a8._0_8_ = pcVar5;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_1a8,"StatPerLevel","");
                              pmVar22 = std::__detail::
                                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar7->config,(key_type *)local_1a8);
                              iVar11 = util::variant::GetInt(pmVar22);
                              piVar1 = &this->character->statpoints;
                              *piVar1 = *piVar1 + iVar11;
                              if ((pointer)local_1a8._0_8_ != pcVar5) {
                                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                              }
                              pWVar7 = this->character->map->world;
                              local_1a8._0_8_ = pcVar5;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_1a8,"SkillPerLevel","");
                              pmVar22 = std::__detail::
                                        _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                        ::operator[]((
                                                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                                  *)&pWVar7->config,(key_type *)local_1a8);
                              iVar11 = util::variant::GetInt(pmVar22);
                              piVar1 = &this->character->skillpoints;
                              *piVar1 = *piVar1 + iVar11;
                              if ((pointer)local_1a8._0_8_ != pcVar5) {
                                operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                              }
                              bVar10 = true;
                              Character::CalculateStats(this->character,true);
                            }
                            if ((pointer)local_1a8._0_8_ != pcVar5) {
                              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                            }
LAB_001877ba:
                            PacketBuilder::PacketBuilder
                                      ((PacketBuilder *)local_1a8,PACKET_RECOVER,PACKET_REPLY,0xb);
                            PacketBuilder::AddInt((PacketBuilder *)local_1a8,this->character->exp);
                            PacketBuilder::AddShort
                                      ((PacketBuilder *)local_1a8,this->character->karma);
                            uVar13 = 0;
                            if (bVar10) {
                              uVar13 = (uint)this->character->level;
                            }
                            PacketBuilder::AddChar((PacketBuilder *)local_1a8,uVar13);
                            if (bVar10) {
                              PacketBuilder::AddShort
                                        ((PacketBuilder *)local_1a8,this->character->statpoints);
                              PacketBuilder::AddShort
                                        ((PacketBuilder *)local_1a8,this->character->skillpoints);
                            }
                            Character::Send(this->character,(PacketBuilder *)local_1a8);
                            if (bVar10) {
                              pMVar8 = this->character->map;
                              p_Var31 = (pMVar8->characters).
                                        super__List_base<Character_*,_std::allocator<Character_*>_>.
                                        _M_impl._M_node.super__List_node_base._M_next;
                              plVar29 = &pMVar8->characters;
                              if (p_Var31 != (_List_node_base *)plVar29) {
                                do {
                                  pCVar27 = (Character *)p_Var31[1]._M_next;
                                  if ((pCVar27 != this->character) &&
                                     (bVar10 = Character::InRange(this->character,pCVar27), bVar10))
                                  {
                                    PacketBuilder::PacketBuilder
                                              ((PacketBuilder *)local_158,PACKET_ITEM,PACKET_ACCEPT,
                                               2);
                                    iVar11 = Character::PlayerID(pCVar27);
                                    PacketBuilder::AddShort((PacketBuilder *)local_158,iVar11);
                                    Character::Send(pCVar27,(PacketBuilder *)local_158);
                                    PacketBuilder::~PacketBuilder((PacketBuilder *)local_158);
                                  }
                                  p_Var31 = p_Var31->_M_next;
                                } while (p_Var31 != (_List_node_base *)plVar29);
                              }
                            }
                          }
                          else {
                            iVar11 = std::__cxx11::string::compare((char *)local_178);
                            if (iVar11 == 0) {
                              pvVar15 = (action->expr).args.
                                        super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                        ._M_impl.super__Deque_impl_data._M_start._M_cur;
                              uVar14 = (long)pvVar15 -
                                       (long)(action->expr).args.
                                             super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                             ._M_impl.super__Deque_impl_data._M_start._M_first >> 6;
                              if (7 < uVar14) {
                                pvVar15 = (_Elt_pointer)
                                          ((ulong)(((uint)uVar14 & 7) << 6) +
                                          *(long *)((long)(action->expr).args.
                                                                                                                    
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                              }
                              iVar11 = util::variant::GetInt(pvVar15);
                              sVar23 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                       size(&(action->expr).args);
                              iVar12 = 1;
                              if (1 < sVar23) {
                                pvVar15 = (action->expr).args.
                                          super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                uVar14 = ((long)pvVar15 -
                                          (long)(action->expr).args.
                                                super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                ._M_impl.super__Deque_impl_data._M_start._M_first >>
                                         6) + 1;
                                if (uVar14 < 8) {
                                  pvVar24 = pvVar15 + 1;
                                }
                                else {
                                  pvVar24 = (variant *)
                                            ((ulong)(((uint)uVar14 & 7) << 6) +
                                            *(long *)((long)(action->expr).args.
                                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                }
                                iVar12 = util::variant::GetInt(pvVar24);
                              }
                              bVar10 = Character::AddItem(this->character,(short)iVar11,iVar12);
                              if (!bVar10) goto LAB_0018737d;
                              if (iVar11 == 1) {
                                PacketBuilder::PacketBuilder
                                          ((PacketBuilder *)local_1a8,PACKET_ITEM,PACKET_GET,9);
                                PacketBuilder::AddShort((PacketBuilder *)local_1a8,0);
                                PacketBuilder::AddShort((PacketBuilder *)local_1a8,1);
                                PacketBuilder::AddThree((PacketBuilder *)local_1a8,iVar12);
                                PacketBuilder::AddChar
                                          ((PacketBuilder *)local_1a8,this->character->weight);
                                PacketBuilder::AddChar
                                          ((PacketBuilder *)local_1a8,this->character->maxweight);
                                Character::Send(this->character,(PacketBuilder *)local_1a8);
                              }
                              else {
                                PacketBuilder::PacketBuilder
                                          ((PacketBuilder *)local_1a8,PACKET_ITEM,PACKET_OBTAIN,6);
                                PacketBuilder::AddShort((PacketBuilder *)local_1a8,iVar11);
                                PacketBuilder::AddThree((PacketBuilder *)local_1a8,iVar12);
                                PacketBuilder::AddChar
                                          ((PacketBuilder *)local_1a8,this->character->weight);
                                Character::Send(this->character,(PacketBuilder *)local_1a8);
                              }
                            }
                            else {
                              iVar11 = std::__cxx11::string::compare((char *)local_178);
                              if (iVar11 == 0) {
                                pvVar15 = (action->expr).args.
                                          super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                          ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                uVar14 = (long)pvVar15 -
                                         (long)(action->expr).args.
                                               super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                               ._M_impl.super__Deque_impl_data._M_start._M_first >>
                                         6;
                                if (7 < uVar14) {
                                  pvVar15 = (_Elt_pointer)
                                            ((ulong)(((uint)uVar14 & 7) << 6) +
                                            *(long *)((long)(action->expr).args.
                                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                }
                                iVar11 = util::variant::GetInt(pvVar15);
                                sVar23 = std::deque<util::variant,_std::allocator<util::variant>_>::
                                         size(&(action->expr).args);
                                iVar12 = 1;
                                if (1 < sVar23) {
                                  pvVar15 = (action->expr).args.
                                            super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                            ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                  uVar14 = ((long)pvVar15 -
                                            (long)(action->expr).args.
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                           >> 6) + 1;
                                  if (uVar14 < 8) {
                                    pvVar24 = pvVar15 + 1;
                                  }
                                  else {
                                    pvVar24 = (variant *)
                                              ((ulong)(((uint)uVar14 & 7) << 6) +
                                              *(long *)((long)(action->expr).args.
                                                                                                                            
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                  }
                                  iVar12 = util::variant::GetInt(pvVar24);
                                }
                                bVar10 = Character::DelItem(this->character,(short)iVar11,iVar12);
                                if (!bVar10) goto LAB_0018737d;
                                PacketBuilder::PacketBuilder
                                          ((PacketBuilder *)local_1a8,PACKET_ITEM,PACKET_KICK,7);
                                PacketBuilder::AddShort((PacketBuilder *)local_1a8,iVar11);
                                iVar11 = Character::HasItem(this->character,(short)iVar11,false);
                                PacketBuilder::AddInt((PacketBuilder *)local_1a8,iVar11);
                                PacketBuilder::AddChar
                                          ((PacketBuilder *)local_1a8,this->character->weight);
                                Character::Send(this->character,(PacketBuilder *)local_1a8);
                              }
                              else {
                                iVar11 = std::__cxx11::string::compare((char *)local_178);
                                if (iVar11 == 0) {
                                  pvVar15 = (action->expr).args.
                                            super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                            ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                  uVar14 = (long)pvVar15 -
                                           (long)(action->expr).args.
                                                 super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                 ._M_impl.super__Deque_impl_data._M_start._M_first
                                           >> 6;
                                  if (7 < uVar14) {
                                    pvVar15 = (_Elt_pointer)
                                              ((ulong)(((uint)uVar14 & 7) << 6) +
                                              *(long *)((long)(action->expr).args.
                                                                                                                            
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                  }
                                  iVar11 = util::variant::GetInt(pvVar15);
                                  this->character->clas = (uchar)iVar11;
                                  Character::CalculateStats(this->character,true);
                                  PacketBuilder::PacketBuilder
                                            ((PacketBuilder *)local_1a8,PACKET_RECOVER,PACKET_LIST,
                                             0x20);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,(uint)this->character->clas)
                                  ;
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,
                                             *this->character->display_str);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,
                                             *this->character->display_intl);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,
                                             *this->character->display_wis);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,
                                             *this->character->display_agi);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,
                                             *this->character->display_con);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,
                                             *this->character->display_cha);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,this->character->maxhp);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,this->character->maxtp);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,this->character->maxsp);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,this->character->maxweight);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,this->character->mindam);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,this->character->maxdam);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,this->character->accuracy);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,this->character->evade);
                                  PacketBuilder::AddShort
                                            ((PacketBuilder *)local_1a8,this->character->armor);
                                  Character::Send(this->character,(PacketBuilder *)local_1a8);
                                }
                                else {
                                  iVar11 = std::__cxx11::string::compare((char *)local_178);
                                  if (iVar11 == 0) {
                                    pvVar15 = (action->expr).args.
                                              super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                              ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                    uVar14 = (long)pvVar15 -
                                             (long)(action->expr).args.
                                                                                                      
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                             >> 6;
                                    if (7 < uVar14) {
                                      pvVar15 = (_Elt_pointer)
                                                ((ulong)(((uint)uVar14 & 7) << 6) +
                                                *(long *)((long)(action->expr).args.
                                                                                                                                
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                    }
                                    iVar11 = util::variant::GetInt(pvVar15);
                                    this->character->race = (Skin)iVar11;
                                    pCVar27 = this->character;
                                    sVar28 = pCVar27->map->id;
                                    uVar9 = pCVar27->x;
                                    y = pCVar27->y;
                                    goto LAB_00187432;
                                  }
                                  iVar11 = std::__cxx11::string::compare((char *)local_178);
                                  if (iVar11 == 0) {
                                    pvVar15 = (action->expr).args.
                                              super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                              ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                    uVar14 = (long)pvVar15 -
                                             (long)(action->expr).args.
                                                                                                      
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                             >> 6;
                                    if (7 < uVar14) {
                                      pvVar15 = (_Elt_pointer)
                                                ((ulong)(((uint)uVar14 & 7) << 6) +
                                                *(long *)((long)(action->expr).args.
                                                                                                                                
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                    }
                                    iVar11 = util::variant::GetInt(pvVar15);
                                    piVar1 = &this->character->karma;
                                    *piVar1 = *piVar1 - iVar11;
                                    if (this->character->karma < 0) {
                                      this->character->karma = 0;
                                    }
                                    PacketBuilder::PacketBuilder
                                              ((PacketBuilder *)local_1a8,PACKET_RECOVER,
                                               PACKET_REPLY,7);
                                    PacketBuilder::AddInt
                                              ((PacketBuilder *)local_1a8,this->character->exp);
                                    PacketBuilder::AddShort
                                              ((PacketBuilder *)local_1a8,this->character->karma);
                                    PacketBuilder::AddChar((PacketBuilder *)local_1a8,0);
                                    Character::Send(this->character,(PacketBuilder *)local_1a8);
                                  }
                                  else {
                                    iVar11 = std::__cxx11::string::compare((char *)local_178);
                                    if (iVar11 != 0) {
                                      iVar11 = std::__cxx11::string::compare((char *)local_178);
                                      if (iVar11 == 0) {
                                        pvVar15 = (action->expr).args.
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                        uVar14 = (long)pvVar15 -
                                                 (long)(action->expr).args.
                                                                                                              
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                                 >> 6;
                                        if (7 < uVar14) {
                                          pvVar15 = (_Elt_pointer)
                                                    ((ulong)(((uint)uVar14 & 7) << 6) +
                                                    *(long *)((long)(action->expr).args.
                                                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                        }
                                        util::variant::GetString_abi_cxx11_
                                                  ((string *)local_1a8,pvVar15);
                                        this_02 = (string *)&this->character->title;
LAB_00187f91:
                                        std::__cxx11::string::operator=(this_02,(string *)local_1a8)
                                        ;
LAB_00187fa4:
                                        if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10)
                                        goto LAB_0018737d;
                                      }
                                      else {
                                        iVar11 = std::__cxx11::string::compare((char *)local_178);
                                        if (iVar11 == 0) {
                                          pvVar15 = (action->expr).args.
                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                          uVar14 = (long)pvVar15 -
                                                   (long)(action->expr).args.
                                                                                                                  
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                                  >> 6;
                                          if (7 < uVar14) {
                                            pvVar15 = (_Elt_pointer)
                                                      ((ulong)(((uint)uVar14 & 7) << 6) +
                                                      *(long *)((long)(action->expr).args.
                                                                                                                                            
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                          }
                                          util::variant::GetString_abi_cxx11_
                                                    ((string *)local_1a8,pvVar15);
                                          this_02 = (string *)&this->character->fiance;
                                          goto LAB_00187f91;
                                        }
                                        iVar11 = std::__cxx11::string::compare((char *)local_178);
                                        if (iVar11 == 0) {
                                          pvVar15 = (action->expr).args.
                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                          uVar14 = (long)pvVar15 -
                                                   (long)(action->expr).args.
                                                                                                                  
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                                  >> 6;
                                          if (7 < uVar14) {
                                            pvVar15 = (_Elt_pointer)
                                                      ((ulong)(((uint)uVar14 & 7) << 6) +
                                                      *(long *)((long)(action->expr).args.
                                                                                                                                            
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                          }
                                          util::variant::GetString_abi_cxx11_
                                                    ((string *)local_1a8,pvVar15);
                                          this_02 = (string *)&this->character->partner;
                                          goto LAB_00187f91;
                                        }
                                        iVar11 = std::__cxx11::string::compare((char *)local_178);
                                        if (iVar11 == 0) {
                                          pvVar15 = (action->expr).args.
                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                          uVar14 = (long)pvVar15 -
                                                   (long)(action->expr).args.
                                                                                                                  
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                                  >> 6;
                                          if (7 < uVar14) {
                                            pvVar15 = (_Elt_pointer)
                                                      ((ulong)(((uint)uVar14 & 7) << 6) +
                                                      *(long *)((long)(action->expr).args.
                                                                                                                                            
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                          }
                                          util::variant::GetString_abi_cxx11_
                                                    ((string *)local_1a8,pvVar15);
                                          this_02 = (string *)&this->character->home;
                                          goto LAB_00187f91;
                                        }
                                        iVar11 = std::__cxx11::string::compare((char *)local_178);
                                        if (iVar11 == 0) {
                                          pvVar15 = (action->expr).args.
                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                          uVar14 = (long)pvVar15 -
                                                   (long)(action->expr).args.
                                                                                                                  
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                                  >> 6;
                                          if (7 < uVar14) {
                                            pvVar15 = (_Elt_pointer)
                                                      ((ulong)(((uint)uVar14 & 7) << 6) +
                                                      *(long *)((long)(action->expr).args.
                                                                                                                                            
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                          }
                                          util::variant::GetString_abi_cxx11_
                                                    ((string *)local_1a8,pvVar15);
                                          pvVar15 = (action->expr).args.
                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                          uVar14 = ((long)pvVar15 -
                                                    (long)(action->expr).args.
                                                                                                                    
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                                  >> 6) + 1;
                                          if (uVar14 < 8) {
                                            pvVar24 = pvVar15 + 1;
                                          }
                                          else {
                                            pvVar24 = (variant *)
                                                      ((ulong)(((uint)uVar14 & 7) << 6) +
                                                      *(long *)((long)(action->expr).args.
                                                                                                                                            
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                          }
                                          uVar13 = util::variant::GetInt(pvVar24);
                                          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                                          std::__cxx11::string::_M_construct<char*>
                                                    ((string *)&local_d8,local_1a8._0_8_,
                                                     (pointer)(local_1a8._8_8_ + local_1a8._0_8_));
                                          local_58._8_4_ = 0;
                                          local_58._12_4_ = 0;
                                          local_58._4_4_ = 0;
                                          local_58._0_4_ = uVar13;
                                          pcStack_40 = std::
                                                  _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:724:26)>
                                                  ::_M_invoke;
                                          local_48 = std::
                                                  _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:724:26)>
                                                  ::_M_manager;
                                          bVar10 = modify_stat(&local_d8,
                                                               (function<int_(int)> *)&local_58,
                                                               this->character);
                                          if (local_48 != (code *)0x0) {
                                            (*local_48)(&local_58,&local_58,__destroy_functor);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                                            operator_delete(local_d8._M_dataplus._M_p,
                                                            local_d8.field_2._0_8_ + 1);
                                          }
                                          if (!bVar10) {
                                            prVar25 = (runtime_error *)
                                                      __cxa_allocate_exception(0x10);
                                            std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_158,"Unknown stat: ",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1a8);
                                            std::runtime_error::runtime_error
                                                      (prVar25,(string *)local_158);
                                            *(undefined ***)prVar25 = &PTR__runtime_error_001d35e0;
                                            __cxa_throw(prVar25,&EOPlus::Runtime_Error::typeinfo,
                                                        std::runtime_error::~runtime_error);
                                          }
                                          goto LAB_00187fa4;
                                        }
                                        iVar11 = std::__cxx11::string::compare((char *)local_178);
                                        if (iVar11 == 0) {
                                          pvVar15 = (action->expr).args.
                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                          uVar14 = (long)pvVar15 -
                                                   (long)(action->expr).args.
                                                                                                                  
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                                  >> 6;
                                          if (7 < uVar14) {
                                            pvVar15 = (_Elt_pointer)
                                                      ((ulong)(((uint)uVar14 & 7) << 6) +
                                                      *(long *)((long)(action->expr).args.
                                                                                                                                            
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                          }
                                          util::variant::GetString_abi_cxx11_
                                                    ((string *)local_1a8,pvVar15);
                                          pvVar15 = (action->expr).args.
                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                          uVar14 = ((long)pvVar15 -
                                                    (long)(action->expr).args.
                                                                                                                    
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                                  >> 6) + 1;
                                          if (uVar14 < 8) {
                                            pvVar24 = pvVar15 + 1;
                                          }
                                          else {
                                            pvVar24 = (variant *)
                                                      ((ulong)(((uint)uVar14 & 7) << 6) +
                                                      *(long *)((long)(action->expr).args.
                                                                                                                                            
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                          }
                                          uVar13 = util::variant::GetInt(pvVar24);
                                          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
                                          std::__cxx11::string::_M_construct<char*>
                                                    ((string *)&local_f8,local_1a8._0_8_,
                                                     (pointer)(local_1a8._8_8_ + local_1a8._0_8_));
                                          local_78._8_4_ = 0;
                                          local_78._12_4_ = 0;
                                          local_78._4_4_ = 0;
                                          local_78._0_4_ = uVar13;
                                          pcStack_60 = std::
                                                  _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:732:26)>
                                                  ::_M_invoke;
                                          local_68 = std::
                                                  _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:732:26)>
                                                  ::_M_manager;
                                          bVar10 = modify_stat(&local_f8,
                                                               (function<int_(int)> *)&local_78,
                                                               this->character);
                                          if (local_68 != (code *)0x0) {
                                            (*local_68)(&local_78,&local_78,__destroy_functor);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                                            operator_delete(local_f8._M_dataplus._M_p,
                                                            local_f8.field_2._0_8_ + 1);
                                          }
                                          if (!bVar10) {
                                            prVar25 = (runtime_error *)
                                                      __cxa_allocate_exception(0x10);
                                            std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_158,"Unknown stat: ",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1a8);
                                            std::runtime_error::runtime_error
                                                      (prVar25,(string *)local_158);
                                            *(undefined ***)prVar25 = &PTR__runtime_error_001d35e0;
                                            __cxa_throw(prVar25,&EOPlus::Runtime_Error::typeinfo,
                                                        std::runtime_error::~runtime_error);
                                          }
                                          goto LAB_00187fa4;
                                        }
                                        iVar11 = std::__cxx11::string::compare((char *)local_178);
                                        if (iVar11 == 0) {
                                          pvVar15 = (action->expr).args.
                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                          uVar14 = (long)pvVar15 -
                                                   (long)(action->expr).args.
                                                                                                                  
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                                  >> 6;
                                          if (7 < uVar14) {
                                            pvVar15 = (_Elt_pointer)
                                                      ((ulong)(((uint)uVar14 & 7) << 6) +
                                                      *(long *)((long)(action->expr).args.
                                                                                                                                            
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                          }
                                          util::variant::GetString_abi_cxx11_
                                                    ((string *)local_1a8,pvVar15);
                                          pvVar15 = (action->expr).args.
                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                          uVar14 = ((long)pvVar15 -
                                                    (long)(action->expr).args.
                                                                                                                    
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                                  >> 6) + 1;
                                          if (uVar14 < 8) {
                                            pvVar24 = pvVar15 + 1;
                                          }
                                          else {
                                            pvVar24 = (variant *)
                                                      ((ulong)(((uint)uVar14 & 7) << 6) +
                                                      *(long *)((long)(action->expr).args.
                                                                                                                                            
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                          }
                                          uVar13 = util::variant::GetInt(pvVar24);
                                          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                                          std::__cxx11::string::_M_construct<char*>
                                                    ((string *)&local_118,local_1a8._0_8_,
                                                     (pointer)(local_1a8._8_8_ + local_1a8._0_8_));
                                          local_98._8_4_ = 0;
                                          local_98._12_4_ = 0;
                                          local_98._4_4_ = 0;
                                          local_98._0_4_ = uVar13;
                                          pcStack_80 = std::
                                                  _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:740:26)>
                                                  ::_M_invoke;
                                          local_88 = std::
                                                  _Function_handler<int_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/eoserv[P]eoserv/src/quest.cpp:740:26)>
                                                  ::_M_manager;
                                          bVar10 = modify_stat(&local_118,
                                                               (function<int_(int)> *)&local_98,
                                                               this->character);
                                          if (local_88 != (code *)0x0) {
                                            (*local_88)(&local_98,&local_98,__destroy_functor);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_118._M_dataplus._M_p != &local_118.field_2) {
                                            operator_delete(local_118._M_dataplus._M_p,
                                                            local_118.field_2._0_8_ + 1);
                                          }
                                          if (!bVar10) {
                                            prVar25 = (runtime_error *)
                                                      __cxa_allocate_exception(0x10);
                                            std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_158,"Unknown stat: ",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1a8);
                                            std::runtime_error::runtime_error
                                                      (prVar25,(string *)local_158);
                                            *(undefined ***)prVar25 = &PTR__runtime_error_001d35e0;
                                            __cxa_throw(prVar25,&EOPlus::Runtime_Error::typeinfo,
                                                        std::runtime_error::~runtime_error);
                                          }
                                          goto LAB_00187fa4;
                                        }
                                        iVar11 = std::__cxx11::string::compare((char *)local_178);
                                        if (iVar11 != 0) goto LAB_0018737d;
                                        pvVar15 = (action->expr).args.
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                        uVar14 = (long)pvVar15 -
                                                 (long)(action->expr).args.
                                                                                                              
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                                 >> 6;
                                        if (7 < uVar14) {
                                          pvVar15 = (_Elt_pointer)
                                                    ((ulong)(((uint)uVar14 & 7) << 6) +
                                                    *(long *)((long)(action->expr).args.
                                                                                                                                        
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                        }
                                        util::variant::GetInt(pvVar15);
                                        iVar11 = util::rand();
                                        local_1a8._0_8_ = local_1a8 + 0x10;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)local_1a8,"r","");
                                        pmVar16 = std::
                                                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                                                  ::operator[](&this->progress,(key_type *)local_1a8
                                                              );
                                        *pmVar16 = (mapped_type)iVar11;
                                        if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10)
                                        goto LAB_0018737d;
                                      }
                                      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
                                      goto LAB_0018737d;
                                    }
                                    pvVar15 = (action->expr).args.
                                              super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                              ._M_impl.super__Deque_impl_data._M_start._M_cur;
                                    uVar14 = (long)pvVar15 -
                                             (long)(action->expr).args.
                                                                                                      
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_first
                                             >> 6;
                                    if (7 < uVar14) {
                                      pvVar15 = (_Elt_pointer)
                                                ((ulong)(((uint)uVar14 & 7) << 6) +
                                                *(long *)((long)(action->expr).args.
                                                                                                                                
                                                  super__Deque_base<util::variant,_std::allocator<util::variant>_>
                                                  ._M_impl.super__Deque_impl_data._M_start._M_node +
                                                  (uVar14 & 0xfffffffffffffff8)));
                                    }
                                    iVar11 = util::variant::GetInt(pvVar15);
                                    piVar1 = &this->character->karma;
                                    *piVar1 = *piVar1 + iVar11;
                                    if (2000 < this->character->karma) {
                                      this->character->karma = 2000;
                                    }
                                    PacketBuilder::PacketBuilder
                                              ((PacketBuilder *)local_1a8,PACKET_RECOVER,
                                               PACKET_REPLY,7);
                                    PacketBuilder::AddInt
                                              ((PacketBuilder *)local_1a8,this->character->exp);
                                    PacketBuilder::AddShort
                                              ((PacketBuilder *)local_1a8,this->character->karma);
                                    PacketBuilder::AddChar((PacketBuilder *)local_1a8,0);
                                    Character::Send(this->character,(PacketBuilder *)local_1a8);
                                  }
                                }
                              }
                            }
                          }
                          PacketBuilder::~PacketBuilder((PacketBuilder *)local_1a8);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_0018737d:
          bVar10 = false;
          goto LAB_00186a66;
        }
        local_1a8._0_8_ = local_1a8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"end","");
        EOPlus::Context::SetState(&this->super_Context,(string *)local_1a8,true);
        if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) goto LAB_00186a57;
      }
    }
  }
  bVar10 = true;
LAB_00186a66:
  if (local_178[0] != local_168) {
    operator_delete(local_178[0],local_168[0] + 1);
  }
  return bVar10;
}

Assistant:

bool Quest_Context::DoAction(const EOPlus::Action& action)
{
	if (this->quest->Disabled())
		return false;

	std::string function_name = action.expr.function;

	if (function_name == "setstate")
	{
		std::string state = util::lowercase(action.expr.args[0]);
		this->SetState(state);
		return true;
	}
	else if (function_name == "reset")
	{
		if (this->progress.find("c") == this->progress.end())
		{
			this->character->ResetQuest(this->quest->ID());
		}
		else
		{
			this->SetState("done");
		}

		return true;
		// *this may not be valid after this point
	}
	else if (function_name == "resetdaily")
	{
		this->progress["d"] = quest_day();
		++this->progress["c"];
		this->SetState("done");
		return true;
	}
	else if (function_name == "end")
	{
		this->SetState("end");
		return true;
	}
	else if (function_name == "startquest")
	{
		short id = int(action.expr.args[0]);

		auto context = character->GetQuest(id);

		if (!context)
		{
			auto it = this->character->world->quests.find(id);

			if (it != this->character->world->quests.end())
			{
				// WARNING: holds a non-tracked reference to shared_ptr
				Quest* quest = it->second.get();
				auto context = std::make_shared<Quest_Context>(this->character, quest);
				this->character->quests[it->first] = context;
				context->SetState(action.expr.args.size() >= 2 ? std::string(action.expr.args[1]) : "begin");
			}
		}
		else if (context->StateName() == "done")
		{
			context->SetState(action.expr.args.size() >= 2 ? std::string(action.expr.args[1]) : "begin");
		}
	}
	else if (function_name == "resetquest")
	{
		short this_id = this->quest->ID();
		short id = int(action.expr.args[0]);

		auto context = this->character->GetQuest(id);

		if (context)
		{
			if (this->progress.find("c") == this->progress.end())
				context->SetState("done");
			else
				this->character->ResetQuest(id);
		}

		if (id == this_id)
		{
			return true;
			// *this is not valid after this point
		}
	}
	else if (function_name == "setqueststate")
	{
		short this_id = this->quest->ID();
		short id = int(action.expr.args[0]);
		std::string state = std::string(action.expr.args[1]);

		// WARNING: holds a non-tracked reference to shared_ptr
		Quest_Context* quest = this->character->GetQuest(id).get();

		if (quest)
		{
			quest->SetState(state);

			if (id == this_id)
				return true;
		}
	}
	else if (function_name == "showhint")
	{
		this->character->StatusMsg(action.expr.args[0]);
	}
	else if (function_name == "quake")
	{
		int strength = 5;

		if (action.expr.args.size() >= 1)
			strength = std::max(1, std::min(8, int(action.expr.args[0])));

		this->character->map->Effect(MAP_EFFECT_QUAKE, strength);
	}
	else if (function_name == "quakeworld")
	{
		int strength = 5;

		if (action.expr.args.size() >= 1)
			strength = std::max(1, std::min(8, int(action.expr.args[0])));

		UTIL_FOREACH(this->character->world->maps, map)
		{
			if (map->exists)
				map->Effect(MAP_EFFECT_QUAKE, strength);
		}
	}
	else if (function_name == "setmap" || function_name == "setcoord")
	{
		this->character->Warp(int(action.expr.args[0]), int(action.expr.args[1]), int(action.expr.args[2]));
	}
	else if (function_name == "playsound")
	{
		this->character->PlaySound(int(action.expr.args[0]));
	}
	else if (function_name == "giveexp")
	{
		bool level_up = false;

		this->character->exp += int(action.expr.args[0]);

		this->character->exp = std::min(this->character->exp, int(this->character->map->world->config["MaxExp"]));

		while (this->character->level < int(this->character->map->world->config["MaxLevel"])
		 && this->character->exp >= this->character->map->world->exp_table[this->character->level+1])
		{
			level_up = true;
			++this->character->level;
			this->character->statpoints += int(this->character->map->world->config["StatPerLevel"]);
			this->character->skillpoints += int(this->character->map->world->config["SkillPerLevel"]);
			this->character->CalculateStats();
		}

		PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 11);
		builder.AddInt(this->character->exp);
		builder.AddShort(this->character->karma);
		builder.AddChar(level_up ? this->character->level : 0);

		if (level_up)
		{
			builder.AddShort(this->character->statpoints);
			builder.AddShort(this->character->skillpoints);
		}

		this->character->Send(builder);

		if (level_up)
		{
			UTIL_FOREACH(this->character->map->characters, character)
			{
				if (character != this->character && this->character->InRange(character))
				{
					PacketBuilder builder(PACKET_ITEM, PACKET_ACCEPT, 2);
					builder.AddShort(character->PlayerID());
					character->Send(builder);
				}
			}
		}
	}
	else if (function_name == "giveitem")
	{
		int id = int(action.expr.args[0]);
		int amount = (action.expr.args.size() >= 2) ? int(action.expr.args[1]) : 1;

		if (this->character->AddItem(id, amount))
		{
			if (id == 1)
			{
				PacketBuilder builder(PACKET_ITEM, PACKET_GET, 9);
				builder.AddShort(0); // UID
				builder.AddShort(id);
				builder.AddThree(amount);
				builder.AddChar(this->character->weight);
				builder.AddChar(this->character->maxweight);
				this->character->Send(builder);
			}
			else
			{
				PacketBuilder builder(PACKET_ITEM, PACKET_OBTAIN, 6);
				builder.AddShort(id);
				builder.AddThree(amount);
				builder.AddChar(this->character->weight);
				this->character->Send(builder);
			}
		}
	}
	else if (function_name == "removeitem")
	{
		int id = int(action.expr.args[0]);
		int amount = (action.expr.args.size() >= 2) ? int(action.expr.args[1]) : 1;

		if (this->character->DelItem(id, amount))
		{
			PacketBuilder builder(PACKET_ITEM, PACKET_KICK, 7);
			builder.AddShort(id);
			builder.AddInt(this->character->HasItem(id));
			builder.AddChar(this->character->weight);
			this->character->Send(builder);
		}
	}
	else if (function_name == "setclass")
	{
		this->character->clas = int(action.expr.args[0]);

		this->character->CalculateStats();

		PacketBuilder builder(PACKET_RECOVER, PACKET_LIST, 32);

		builder.AddShort(this->character->clas);
		builder.AddShort(this->character->display_str);
		builder.AddShort(this->character->display_intl);
		builder.AddShort(this->character->display_wis);
		builder.AddShort(this->character->display_agi);
		builder.AddShort(this->character->display_con);
		builder.AddShort(this->character->display_cha);
		builder.AddShort(this->character->maxhp);
		builder.AddShort(this->character->maxtp);
		builder.AddShort(this->character->maxsp);
		builder.AddShort(this->character->maxweight);
		builder.AddShort(this->character->mindam);
		builder.AddShort(this->character->maxdam);
		builder.AddShort(this->character->accuracy);
		builder.AddShort(this->character->evade);
		builder.AddShort(this->character->armor);

		this->character->Send(builder);
	}
	else if (function_name == "setrace")
	{
		this->character->race = Skin(int(action.expr.args[0]));
		this->character->Warp(this->character->map->id, this->character->x, this->character->y);
	}
	else if (function_name == "removekarma")
	{
		this->character->karma -= int(action.expr.args[0]);

		if (this->character->karma < 0)
			this->character->karma = 0;

		PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 7);
		builder.AddInt(this->character->exp);
		builder.AddShort(this->character->karma);
		builder.AddChar(0);
		this->character->Send(builder);
	}
	else if (function_name == "givekarma")
	{
		this->character->karma += int(action.expr.args[0]);

		if (this->character->karma > 2000)
			this->character->karma = 2000;

		PacketBuilder builder(PACKET_RECOVER, PACKET_REPLY, 7);
		builder.AddInt(this->character->exp);
		builder.AddShort(this->character->karma);
		builder.AddChar(0);
		this->character->Send(builder);
	}
	else if (function_name == "settitle")
	{
		this->character->title = std::string(action.expr.args[0]);
	}
	else if (function_name == "setfiance")
	{
		this->character->fiance = std::string(action.expr.args[0]);
	}
	else if (function_name == "setpartner")
	{
		this->character->partner = std::string(action.expr.args[0]);
	}
	else if (function_name == "sethome")
	{
		this->character->home = std::string(action.expr.args[0]);
	}
	else if (function_name == "setstat")
	{
		std::string stat = action.expr.args[0];
		int value = action.expr.args[1];

		if (!modify_stat(stat, [value](int) { return value; }, this->character))
			throw EOPlus::Runtime_Error("Unknown stat: " + stat);
	}
	else if (function_name == "givestat")
	{
		std::string stat = action.expr.args[0];
		int value = action.expr.args[1];

		if (!modify_stat(stat, [value](int x) { return x + value; }, this->character))
			throw EOPlus::Runtime_Error("Unknown stat: " + stat);
	}
	else if (function_name == "removestat")
	{
		std::string stat = action.expr.args[0];
		int value = action.expr.args[1];

		if (!modify_stat(stat, [value](int x) { return x - value; }, this->character))
			throw EOPlus::Runtime_Error("Unknown stat: " + stat);
	}
	else if (function_name == "roll")
	{
		this->progress["r"] = util::rand(1, int(action.expr.args[0]));
	}

	return false;
}